

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnOpcode(BinaryReaderIR *this,Opcode opcode)

{
  anon_struct_3_3_4b311855_for_features_used *paVar1;
  bool *pbVar2;
  Func *pFVar3;
  _Elt_pointer puVar4;
  _Head_base<0UL,_wabt::CodeMetadataExpr_*,_false> _Var5;
  _Elt_pointer pEVar6;
  _Map_pointer ppEVar7;
  uint8_t uVar8;
  Result RVar9;
  Type TVar10;
  _Elt_pointer pEVar11;
  Opcode local_44;
  _Head_base<0UL,_wabt::CodeMetadataExpr_*,_false> local_40;
  Location local_38;
  
  pFVar3 = this->current_func_;
  local_44.enum_ = opcode.enum_;
  GetLocation(&local_38,this);
  pEVar11 = (this->code_metadata_queue_).entries.
            super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (((this->code_metadata_queue_).entries.
       super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur != pEVar11) && (pEVar11->func == pFVar3)) {
    puVar4 = (pEVar11->func_queue).
             super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((pEVar11->func_queue).
        super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar4) {
      pEVar6 = (this->code_metadata_queue_).entries.
               super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      std::
      deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
      ::~deque(&pEVar11->func_queue);
      if (pEVar11 == pEVar6 + -1) {
        operator_delete((this->code_metadata_queue_).entries.
                        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first,0x1b8);
        ppEVar7 = (this->code_metadata_queue_).entries.
                  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node = ppEVar7 + 1;
        pEVar11 = ppEVar7[1];
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first = pEVar11;
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = pEVar11 + 5;
      }
      else {
        pEVar11 = (this->code_metadata_queue_).entries.
                  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      (this->code_metadata_queue_).entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = pEVar11;
    }
    else {
      _Var5._M_head_impl =
           (puVar4->_M_t).
           super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
           .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl;
      if ((pEVar11->func->loc).field_1.field_1.offset +
          ((_Var5._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1
          .offset == (long)local_38.field_1.field_1.offset - 1U) {
        ((_Var5._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_len =
             0;
        ((_Var5._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_str =
             (char *)0x0;
        ((_Var5._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1.
        offset = (long)local_38.field_1.field_1.offset - 1U;
        _Var5._M_head_impl =
             (puVar4->_M_t).
             super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
             .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl;
        (puVar4->_M_t).
        super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>.
        _M_t.
        super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
        .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl =
             (CodeMetadataExpr *)0x0;
        std::
        deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
        ::pop_front(&pEVar11->func_queue);
        if (_Var5._M_head_impl != (CodeMetadataExpr *)0x0) {
          local_40._M_head_impl = _Var5._M_head_impl;
          RVar9 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                  &local_40);
          if (local_40._M_head_impl == (CodeMetadataExpr *)0x0) {
            return (Result)RVar9.enum_;
          }
          (*((local_40._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr._vptr_Expr[1])
                    ();
          return (Result)RVar9.enum_;
        }
      }
    }
  }
  TVar10 = Opcode::GetResultType(&local_44);
  paVar1 = &this->module_->features_used;
  paVar1->simd = (bool)(paVar1->simd | TVar10.enum_ == V128);
  uVar8 = Opcode::GetPrefix(&local_44);
  pbVar2 = &(this->module_->features_used).threads;
  *pbVar2 = (bool)(*pbVar2 | uVar8 == 0xfe);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnOpcode(Opcode opcode) {
  std::unique_ptr<CodeMetadataExpr> metadata =
      code_metadata_queue_.pop_match(current_func_, GetLocation().offset - 1);
  if (metadata) {
    return AppendExpr(std::move(metadata));
  }
  module_->features_used.simd |= (opcode.GetResultType() == Type::V128);
  module_->features_used.threads |= (opcode.GetPrefix() == 0xfe);
  return Result::Ok;
}